

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O1

ThresholdAlgorithmResult *
topk_algorithms::threshold_algorithm
          (ThresholdAlgorithmResult *__return_storage_ptr__,Problem *problem,RankSize k)

{
  Count *pCVar1;
  Queue *this;
  __node_base_ptr key;
  pointer pKVar2;
  RankSize RVar3;
  _Vector_impl *p_Var4;
  int iVar5;
  undefined4 extraout_var;
  pointer pQVar6;
  undefined4 extraout_var_00;
  Value VVar7;
  undefined4 extraout_var_01;
  size_type sVar8;
  ulong uVar9;
  const_iterator __begin1;
  pointer pQVar10;
  _Vector_base<Queue,_std::allocator<Queue>_> *p_Var11;
  pointer pKVar12;
  Rank *pRVar13;
  pointer pQVar14;
  Key *pKVar15;
  _Vector_base<Queue,_std::allocator<Queue>_> *p_Var16;
  ThresholdAlgorithmResult *pTVar17;
  ulong uVar18;
  pointer this_00;
  long lVar19;
  RankSize *pRVar20;
  bool bVar21;
  undefined1 local_d8 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  processed_keys;
  KeyValue local_98;
  RankSize local_88;
  Count local_78;
  RankSize local_70;
  RankSize *local_68;
  _Vector_base<Queue,_std::allocator<Queue>_> *local_60;
  ThresholdAlgorithmResult *local_58;
  pointer local_50;
  _Vector_base<Queue,_std::allocator<Queue>_> *local_48;
  ulong local_40;
  pointer local_38;
  
  local_70 = k;
  local_60 = (_Vector_base<Queue,_std::allocator<Queue>_> *)problem;
  iVar5 = (**problem->_vptr_Problem)(problem);
  p_Var11 = (_Vector_base<Queue,_std::allocator<Queue>_> *)CONCAT44(extraout_var,iVar5);
  if ((_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555555 < p_Var11) {
    std::__throw_length_error("vector::reserve");
  }
  local_58 = __return_storage_ptr__;
  if (p_Var11 == (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0) {
    this_00 = (pointer)0x0;
    local_50 = (pointer)0x0;
    local_40 = 0;
    local_78 = 0;
    pQVar6 = this_00;
  }
  else {
    pQVar6 = std::_Vector_base<Queue,_std::allocator<Queue>_>::_M_allocate(p_Var11,(size_t)problem);
    pQVar14 = (pointer)((long)pQVar6 + (long)p_Var11 * 0x18);
    p_Var16 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
    local_78 = 0;
    local_40 = 0;
    local_50 = (pointer)0x0;
    pQVar10 = pQVar6;
    local_68 = (RankSize *)p_Var11;
    do {
      local_48 = p_Var16;
      local_38 = pQVar6;
      iVar5 = (*(*(_func_int ***)&local_60->_M_impl)[1])();
      if (pQVar10 == pQVar14) {
        lVar19 = (long)pQVar10 - (long)local_38;
        if (lVar19 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar9 = (lVar19 >> 3) * -0x5555555555555555;
        uVar18 = uVar9;
        if (pQVar10 == local_38) {
          uVar18 = 1;
        }
        p_Var11 = (_Vector_base<Queue,_std::allocator<Queue>_> *)(uVar18 + uVar9);
        if ((_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555554 < p_Var11) {
          p_Var11 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555555;
        }
        if (CARRY8(uVar18,uVar9)) {
          p_Var11 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x555555555555555;
        }
        pQVar6 = std::_Vector_base<Queue,_std::allocator<Queue>_>::_M_allocate
                           (p_Var11,(size_t)p_Var16);
        *(undefined8 *)((long)pQVar6 + lVar19) = 0;
        *(RankSize *)((long)pQVar6 + lVar19 + 8) = CONCAT44(extraout_var_00,iVar5);
        *(undefined8 *)((long)pQVar6 + lVar19 + 0x10) = 0;
        this_00 = pQVar6;
        for (pQVar14 = local_38; pQVar10 != pQVar14; pQVar14 = (pointer)&pQVar14[1]._index) {
          this_00[1]._rank = pQVar14[1]._rank;
          RVar3 = pQVar14->_index;
          this_00->_rank = pQVar14->_rank;
          this_00->_index = RVar3;
          this_00 = (pointer)&this_00[1]._index;
        }
        if (local_38 != (pointer)0x0) {
          operator_delete(local_38);
        }
        pQVar14 = (pointer)((long)pQVar6 + (long)p_Var11 * 0x18);
      }
      else {
        pQVar10->_rank = (Rank *)0x0;
        pQVar10->_index = CONCAT44(extraout_var_00,iVar5);
        pQVar10[1]._rank = (Rank *)0x0;
        this_00 = pQVar10;
        pQVar6 = local_38;
      }
      pRVar20 = local_68;
      if (this_00[1]._rank <
          (Rank *)((*(long *)(this_00->_index + 0x10) - *(long *)(this_00->_index + 8) >> 3) *
                  -0x5555555555555555)) {
        VVar7 = threshold_algorithm::Queue::head_value((Queue *)this_00);
        local_40 = local_40 + VVar7;
        pQVar10 = (pointer)((*(long *)(this_00->_index + 0x10) - *(long *)(this_00->_index + 8) >> 3
                            ) * -0x5555555555555555);
        if (local_50 <= pQVar10) {
          local_50 = pQVar10;
        }
        local_78 = (long)&pQVar10->_rank + local_78;
        this_00 = (pointer)&this_00[1]._index;
      }
      p_Var16 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
                ((long)&(local_48->_M_impl).super__Vector_impl_data._M_start + 1);
      pQVar10 = this_00;
    } while (p_Var16 != (_Vector_base<Queue,_std::allocator<Queue>_> *)pRVar20);
  }
  pTVar17 = local_58;
  local_d8 = (undefined1  [8])&processed_keys._M_h._M_rehash_policy._M_next_resize;
  processed_keys._M_h._M_buckets = (__buckets_ptr)0x1;
  processed_keys._M_h._M_bucket_count = 0;
  processed_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  processed_keys._M_h._M_element_count._0_4_ = 0x3f800000;
  processed_keys._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  processed_keys._M_h._M_rehash_policy._4_4_ = 0;
  processed_keys._M_h._M_rehash_policy._M_next_resize = 0;
  (local_58->topk)._k = 0;
  (local_58->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_58->stats).k = 0;
  (local_58->stats).num_ranks = 0;
  (local_58->stats).largest_rank = 0;
  (local_58->stats).entries = 0;
  (local_58->stats).random_access_hit = 0;
  (local_58->stats).random_access_miss = 0;
  (local_58->stats).ordered_access_hit = 0;
  (local_58->stats).ordered_access_miss = 0;
  (local_58->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_58->topk)._entries.super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_58->topk)._k = local_70;
  (local_58->stats).k = local_70;
  local_38 = pQVar6;
  iVar5 = (***(_func_int ***)&local_60->_M_impl)();
  (pTVar17->stats).num_ranks = CONCAT44(extraout_var_01,iVar5);
  (pTVar17->stats).largest_rank = (Count)local_50;
  (pTVar17->stats).entries = local_78;
  local_68 = &pQVar6->_index;
  p_Var11 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
  uVar18 = local_40;
  do {
    local_60 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
               (((long)this_00 - (long)pQVar6 >> 3) * -0x5555555555555555);
    if (local_60 <= p_Var11) break;
    this = (Queue *)((long)pQVar6 + (long)p_Var11 * 0x18);
    local_48 = p_Var11;
    if (*(ulong *)(this + 0x10) <
        (ulong)((*(long *)(*(long *)(this + 8) + 0x10) - *(long *)(*(long *)(this + 8) + 8) >> 3) *
               -0x5555555555555555)) {
      VVar7 = threshold_algorithm::Queue::head_value(this);
      *(Value *)this = VVar7;
      if (**(char **)(this + 8) == '\x01') {
        __assert_fail("!dirty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/laurolins[P]topkube_benchmark/src/rank.hh"
                      ,0x69,"const Entry &rank::Rank::top(RankSize) const");
      }
      lVar19 = *(long *)(*(char **)(this + 8) + 8);
      pKVar15 = (Key *)(lVar19 + *(long *)(lVar19 + 0x10 + *(long *)(this + 0x10) * 0x18) * 0x18);
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      VVar7 = threshold_algorithm::Queue::head_value(this);
      *(Value *)this = *(long *)this - VVar7;
      pQVar6 = local_38;
    }
    else {
      pKVar15 = (Key *)0x0;
    }
    uVar18 = uVar18 - *(long *)this;
    if (pKVar15 == (Key *)0x0) {
      pQVar14 = (pointer)&this_00[-2]._index;
      local_88 = *(RankSize *)(this + 0x10);
      local_98._key = *(Key *)this;
      local_98._value = *(Value *)(this + 8);
      *(RankSize *)(this + 0x10) = this_00[-1]._index;
      pRVar13 = this_00[-1]._rank;
      *(RankSize *)this = this_00[-2]._index;
      *(Rank **)(this + 8) = pRVar13;
      this_00[-1]._index = local_88;
      this_00[-2]._index = local_98._key;
      this_00[-1]._rank = (Rank *)local_98._value;
      p_Var11 = local_48;
      if ((_Vector_base<Queue,_std::allocator<Queue>_> *)
          (((long)pQVar14 - (long)pQVar6 >> 3) * -0x5555555555555555) <= local_48) {
        p_Var11 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
      }
      bVar21 = true;
      pTVar17 = local_58;
    }
    else {
      local_98._key = *pKVar15;
      local_50 = this_00;
      local_40 = uVar18;
      sVar8 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_d8,&local_98._key);
      if (sVar8 == 0) {
        (local_58->stats).ordered_access_hit = (local_58->stats).ordered_access_hit + 1;
        key = (__node_base_ptr)*pKVar15;
        pRVar13 = (Rank *)pKVar15[1];
        bVar21 = local_60 == (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
        p_Var4 = &local_60->_M_impl;
        p_Var16 = (_Vector_base<Queue,_std::allocator<Queue>_> *)0x0;
        p_Var11 = local_48;
        pRVar20 = local_68;
        do {
          if (p_Var11 != p_Var16) {
            VVar7 = rank::Rank::value_of((Rank *)*pRVar20,(Key)key);
            pRVar13 = (Rank *)(&pRVar13->_dirty + VVar7);
            pCVar1 = &(local_58->stats).random_access_hit + (VVar7 == 0);
            *pCVar1 = *pCVar1 + 1;
            p_Var11 = local_48;
          }
          p_Var16 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
                    ((long)&(p_Var16->_M_impl).super__Vector_impl_data._M_start + 1);
          pRVar20 = pRVar20 + 3;
        } while ((_Vector_base<Queue,_std::allocator<Queue>_> *)
                 ((long)&(p_Var4->super__Vector_impl_data)._M_start + (ulong)bVar21) != p_Var16);
        local_98._key = (Key)local_d8;
        processed_keys._M_h._M_single_bucket = key;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_98._key,&processed_keys._M_h._M_single_bucket,&local_98);
        pQVar6 = local_38;
        pTVar17 = local_58;
        local_98._key = (Key)key;
        local_98._value = (Value)pRVar13;
        TopK::insert(&local_58->topk,&local_98);
        uVar18 = local_40;
        pQVar14 = local_50;
        if (local_70 != 0) {
          pKVar12 = (pTVar17->topk)._entries.
                    super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pKVar2 = (pTVar17->topk)._entries.
                   super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar9 = (long)pKVar2 - (long)pKVar12 >> 4;
          for (; pKVar2 != pKVar12; pKVar12 = pKVar12 + 1) {
            uVar9 = uVar9 - (pKVar12->_value < local_40);
          }
          if (local_70 <= uVar9) {
            bVar21 = false;
            p_Var11 = local_48;
            goto LAB_0010aafd;
          }
        }
        bVar21 = true;
        p_Var11 = (_Vector_base<Queue,_std::allocator<Queue>_> *)
                  ((ulong)((long)&(local_48->_M_impl).super__Vector_impl_data._M_start + 1) %
                  (ulong)local_60);
      }
      else {
        pCVar1 = &(local_58->stats).ordered_access_miss;
        *pCVar1 = *pCVar1 + 1;
        bVar21 = true;
        p_Var11 = local_48;
        pTVar17 = local_58;
        uVar18 = local_40;
        pQVar14 = local_50;
      }
    }
LAB_0010aafd:
    this_00 = pQVar14;
  } while (bVar21);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d8);
  if (pQVar6 != (pointer)0x0) {
    operator_delete(pQVar6);
  }
  return pTVar17;
}

Assistant:

ThresholdAlgorithmResult threshold_algorithm(const Problem *problem, RankSize k) {

        //
        struct Queue {
            Queue(const Rank* rank): _rank(rank) {};
            bool empty() const { return _index >= _rank->size(); }
            Value head_value() const { return _index < _rank->size() ? _rank->top(_index).value() : 0; }
            Value value_of(Key key) const { return _rank->value_of(key); }
            const Entry* next() {
                if (_index < _rank->size()) {
                    _head_value_drop = head_value();
                    auto &result = _rank->top(_index);
                    ++_index;
                    _head_value_drop -= head_value();
                    return &result;
                }
                else {
                    return nullptr;
                }
            }
            Value head_value_drop() const { return _head_value_drop; }
            Value _head_value_drop { 0 };
            const Rank* _rank;
            RankSize _index { 0 };
        };

        // create m queues
        Count largest_rank = 0;
        Count entries      = 0;
        
        std::vector<Queue> queues;
        Value              head_sum = 0;
        auto m = problem->size();
        queues.reserve(m);
        for (auto i=0;i<m;++i) {
            queues.push_back(Queue(problem->rank(i)));
            if (!queues.back().empty()) {
                head_sum += queues.back().head_value();
                
                auto rank_size = queues.back()._rank->size();
                largest_rank   = std::max(largest_rank, rank_size);
                entries       += rank_size;
                
                
            }
            else {
                queues.pop_back();
            }
        };

        std::unordered_set<Key> processed_keys;

        ThresholdAlgorithmResult result;
        result.topk.k(k);
        auto &topk  = result.topk;
        auto &stats = result.stats;

        stats.k            = k;
        stats.num_ranks    = problem->size();
        stats.largest_rank = largest_rank;
        stats.entries      = entries;

        std::size_t i = 0;
        while (i < queues.size()) {

            // for each queue generate next element
            auto &q = queues.at(i);

            auto top_record  = q.next();
            head_sum        -= q.head_value_drop();

            if ( top_record ) {
                if (!processed_keys.count(top_record->key())) {

                    ++stats.ordered_access_hit;

                    // if key has not beed processed
                    auto record = KeyValue { top_record->key(), top_record->value() };

                    // add all summands to record
                    for (auto j=0;j<queues.size();++j) {
                        if (i != j) {
                            auto value = queues[j].value_of(record.key());
                            record.value_add(value);
                            if (value) {
                                ++stats.random_access_hit;
                            }
                            else {
                                ++stats.random_access_miss;
                            }
                        }
                    }

                    processed_keys.insert(record.key());

                    topk.insert({record.key(), record.value()});

                    if (k && topk.count_entries_above_or_equal(head_sum) >= k) {
                        // proven that we have a valid set of topk entries
                        break;
                    }

                    i = (i + 1) % queues.size();
                }
                else {
                    ++stats.ordered_access_miss;
                }
            }
            else { // queue is emtpy
                std::swap(queues[i], queues.back());
                queues.pop_back();
                if (i >= queues.size()) {
                    i = 0;
                }
            }
        }

        return result;
    
    }